

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackDebGenerator.cxx
# Opt level: O2

bool __thiscall cmCPackDebGenerator::SupportsComponentInstallation(cmCPackDebGenerator *this)

{
  bool bVar1;
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"CPACK_DEB_COMPONENT_INSTALL",&local_31);
  bVar1 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return bVar1;
}

Assistant:

bool cmCPackDebGenerator::SupportsComponentInstallation() const
  {
  if (IsOn("CPACK_DEB_COMPONENT_INSTALL"))
    {
      return true;
    }
  else
    {
      return false;
    }
  }